

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

void __thiscall OB::Parg::set(Parg *this,string *_name,string *_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *pmVar1;
  long lVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  undefined1 local_298 [8];
  stringstream out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [7];
  ios_base local_218 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string *local_b0;
  undefined1 local_a8 [8];
  string delim;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  string _short;
  
  local_a8 = (undefined1  [8])&delim._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,",","");
  lVar2 = std::__cxx11::string::find((char *)_name,(ulong)local_a8,0);
  if (lVar2 == -1) {
    if (_name->_M_string_length == 1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->flags_,_name);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      pmVar1 = &this->data_;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar4->long_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      pmVar4->mode_ = true;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_replace
                ((ulong)&pmVar4->value_,0,(char *)(pmVar4->value_)._M_string_length,0x12697c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "  -",_name);
      plVar5 = (long *)std::__cxx11::string::append(local_50);
      local_298 = (undefined1  [8])local_288;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        local_288[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_288[0]._8_8_ = plVar5[3];
      }
      else {
        local_288[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_298 = (undefined1  [8])*plVar5;
      }
      _out = plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_298);
    }
    else {
      pmVar1 = &this->data_;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar4->long_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      pmVar4->mode_ = true;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_replace
                ((ulong)&pmVar4->value_,0,(char *)(pmVar4->value_)._M_string_length,0x12697c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "  --",_name);
      plVar5 = (long *)std::__cxx11::string::append(local_50);
      local_298 = (undefined1  [8])local_288;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        local_288[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_288[0]._8_8_ = plVar5[3];
      }
      else {
        local_288[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_298 = (undefined1  [8])*plVar5;
      }
      _out = plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_298);
    }
    if (local_298 != (undefined1  [8])local_288) {
      operator_delete((void *)local_298,local_288[0]._M_allocated_capacity + 1);
    }
    if (local_50 != (undefined1  [8])&_short._M_string_length) {
      operator_delete((void *)local_50,
                      CONCAT71(_short._M_string_length._1_7_,(undefined1)_short._M_string_length) +
                      1);
    }
  }
  else {
    _out = 0;
    local_288[0]._M_allocated_capacity = local_288[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_50 = (undefined1  [8])&_short._M_string_length;
    _short._M_dataplus._M_p = (pointer)0x0;
    _short._M_string_length._0_1_ = 0;
    local_298 = (undefined1  [8])local_288;
    delimit((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&delim.field_2 + 8),this,_name,(string *)local_a8);
    if ((names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == (pointer)delim.field_2._8_8_) ||
       (0x40 < (ulong)((long)names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - delim.field_2._8_8_))) {
      __assert_fail("names.size() >= 1 && names.size() <= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/octobanana[P]hr/src/ob/parg.hh"
                    ,0x136,"void OB::Parg::set(const std::string &, const std::string &)");
    }
    std::__cxx11::string::_M_assign((string *)local_298);
    if ((long)names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - delim.field_2._8_8_ == 0x40) {
      if (*(long *)(delim.field_2._8_8_ + 0x28) != 1) {
        __assert_fail("names.at(1).size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/octobanana[P]hr/src/ob/parg.hh"
                      ,0x13d,"void OB::Parg::set(const std::string &, const std::string &)");
      }
      std::__cxx11::string::_M_assign((string *)local_50);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->flags_,(key_type *)local_50);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    pmVar1 = &this->data_;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_298);
    std::__cxx11::string::_M_assign((string *)&pmVar4->long_);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_298);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_298);
    pmVar4->mode_ = true;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_298);
    std::__cxx11::string::_M_replace
              ((ulong)&pmVar4->value_,0,(char *)(pmVar4->value_)._M_string_length,0x12697c);
    std::operator+(&local_110,"  -",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_c0 = *plVar7;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar7;
      local_d0 = (long *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_b0 = _info;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_298);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    pbVar9 = (pointer)(plVar5 + 2);
    if ((pointer)*plVar5 == pbVar9) {
      local_60._0_8_ = (pbVar9->_M_dataplus)._M_p;
      local_60._8_8_ = plVar5[3];
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_60;
    }
    else {
      local_60._0_8_ = (pbVar9->_M_dataplus)._M_p;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
    }
    *plVar5 = (long)pbVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&this->modes_,
               (ulong)names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_60) {
      operator_delete(names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_60._0_8_ + 1)
                     );
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&delim.field_2 + 8));
    if (local_50 != (undefined1  [8])&_short._M_string_length) {
      operator_delete((void *)local_50,
                      CONCAT71(_short._M_string_length._1_7_,(undefined1)_short._M_string_length) +
                      1);
    }
    _info = local_b0;
    if (local_298 != (undefined1  [8])local_288) {
      operator_delete((void *)local_298,local_288[0]._M_allocated_capacity + 1);
      _info = local_b0;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288[0]._M_local_buf,"    ",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_288[0]._M_local_buf,(_info->_M_dataplus)._M_p,
                      _info->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_50);
  if (local_50 != (undefined1  [8])&_short._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(_short._M_string_length._1_7_,(undefined1)_short._M_string_length) + 1)
    ;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_298);
  std::ios_base::~ios_base(local_218);
  if (local_a8 != (undefined1  [8])&delim._M_string_length) {
    operator_delete((void *)local_a8,delim._M_string_length + 1);
  }
  return;
}

Assistant:

void set(std::string const& _name, std::string const& _info)
  {
    // sets a flag
    std::string delim {","};
    if (_name.find(delim) != std::string::npos)
    {
      // short and long
      bool has_short {false};
      std::string _long;
      std::string _short;

      auto const names = delimit(_name, delim);
      assert(names.size() >= 1 && names.size() <= 2);
      _long = names.at(0);

      if (names.size() == 2) has_short = true;
      if (has_short)
      {
        // short name must be one char
        assert(names.at(1).size() == 1);
        _short = names.at(1);
      }

      flags_[_short] = _long;
      data_[_long].long_ = _long;
      data_[_long].short_ = _short;
      data_[_long].mode_ = true;
      data_[_long].value_ = "0";
      modes_.append("  -" + _short + ", --" + _long + "\n");
    }
    else
    {
      if (_name.size() == 1)
      {
        // short
        flags_[_name] = _name;
        data_[_name].long_ = _name;
        data_[_name].short_ = _name;
        data_[_name].mode_ = true;
        data_[_name].value_ = "0";
        modes_.append("  -" + _name + "\n");
      }
      else
      {
        // long
        data_[_name].long_ = _name;
        data_[_name].mode_ = true;
        data_[_name].value_ = "0";
        modes_.append("  --" + _name + "\n");
      }
    }

    std::stringstream out;
    out << "    " << _info << "\n";
    modes_.append(out.str());
  }